

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_bspline_eval
          (REF_INT degree,REF_INT n_control_point,REF_DBL *knots,REF_DBL t,REF_DBL *control_points,
          REF_DBL *val)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT point;
  REF_INT i;
  REF_DBL N [16];
  REF_INT local_3c;
  REF_DBL *pRStack_38;
  REF_INT span;
  REF_DBL *val_local;
  REF_DBL *control_points_local;
  REF_DBL t_local;
  REF_DBL *knots_local;
  REF_INT local_10;
  REF_INT n_control_point_local;
  REF_INT degree_local;
  
  *val = 0.0;
  pRStack_38 = val;
  val_local = control_points;
  control_points_local = (REF_DBL *)t;
  t_local = (REF_DBL)knots;
  knots_local._4_4_ = n_control_point;
  local_10 = degree;
  if (degree < 0x10) {
    uVar1 = ref_geom_bspline_span_index(degree,n_control_point,knots,t,&local_3c);
    if (uVar1 == 0) {
      uVar1 = ref_geom_bspline_basis
                        (local_10,(REF_DBL *)t_local,(REF_DBL)control_points_local,local_3c,
                         (REF_DBL *)&point);
      if (uVar1 == 0) {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < local_10 + 1;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          iVar2 = (local_3c - local_10) + ref_private_macro_code_rss;
          if (iVar2 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x10ff,"ref_geom_bspline_eval","point negative");
            return 1;
          }
          if (knots_local._4_4_ <= iVar2) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1100,"ref_geom_bspline_eval","point >= n_control_point");
            return 1;
          }
          *pRStack_38 = *(double *)(&point + (long)ref_private_macro_code_rss * 2) *
                        val_local[iVar2] + *pRStack_38;
        }
        n_control_point_local = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x10fc,"ref_geom_bspline_eval",(ulong)uVar1,"basis");
        n_control_point_local = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10fb
             ,"ref_geom_bspline_eval",(ulong)uVar1,"index");
      n_control_point_local = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10f9,
           "ref_geom_bspline_eval","temp variables sized smaller than degree");
    n_control_point_local = 1;
  }
  return n_control_point_local;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_eval(REF_INT degree,
                                         REF_INT n_control_point,
                                         REF_DBL *knots, REF_DBL t,
                                         REF_DBL *control_points,
                                         REF_DBL *val) {
  REF_INT span;
  REF_DBL N[16];
  REF_INT i, point;
  *val = 0.0;
  RAS(degree < 16, "temp variables sized smaller than degree");
  RSS(ref_geom_bspline_span_index(degree, n_control_point, knots, t, &span),
      "index");
  RSS(ref_geom_bspline_basis(degree, knots, t, span, N), "basis");
  for (i = 0; i < degree + 1; i++) {
    point = span - degree + i;
    RAS(point >= 0, "point negative");
    RAS(point < n_control_point, "point >= n_control_point");
    (*val) += N[i] * control_points[point];
  }
  return REF_SUCCESS;
}